

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O1

void ft_smooth_lcd_spans(int y,int count,FT_Span *spans,TOrigin *target)

{
  int iVar1;
  uchar *puVar2;
  unsigned_short uVar3;
  uchar *puVar4;
  
  if (count != 0) {
    puVar2 = target->origin;
    iVar1 = target->pitch;
    do {
      uVar3 = spans->len;
      if (uVar3 != 0) {
        puVar4 = puVar2 + ((long)spans->x * 3 - (long)y * (long)iVar1);
        do {
          *puVar4 = spans->coverage;
          puVar4 = puVar4 + 3;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      count = count + -1;
      spans = spans + 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void
  ft_smooth_lcd_spans( int             y,
                       int             count,
                       const FT_Span*  spans,
                       TOrigin*        target )
  {
    unsigned char*  dst_line = target->origin - y * target->pitch;
    unsigned char*  dst;
    unsigned short  w;


    for ( ; count--; spans++ )
      for ( dst = dst_line + spans->x * 3, w = spans->len; w--; dst += 3 )
        *dst = spans->coverage;
  }